

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

Result file_read_aligned(char *filename,size_t align,FileData *out_file_data)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  u8 *__ptr;
  char *__ptr_00;
  ulong __size;
  size_t sStack_30;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x2c);
    fprintf(_stderr,"unable to open file \"%s\".\n",filename);
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (iVar1 < 0) {
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x1b);
      __ptr_00 = "fseek to end failed.\n";
      sStack_30 = 0x15;
    }
    else {
      sVar2 = ftell(__stream);
      if ((long)sVar2 < 0) {
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x1d
               );
        __ptr_00 = "ftell failed.";
        sStack_30 = 0xd;
      }
      else {
        iVar1 = fseek(__stream,0,0);
        if (iVar1 < 0) {
          fprintf(_stderr,"%s:%d: ",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",
                  0x1e);
          __ptr_00 = "fseek to beginning failed.\n";
          sStack_30 = 0x1b;
        }
        else {
          __size = -align & (align + sVar2) - 1;
          __ptr = (u8 *)calloc(1,__size);
          if (__ptr == (u8 *)0x0) {
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",
                    0x31);
            __ptr_00 = "allocation failed.\n";
            sStack_30 = 0x13;
          }
          else {
            sVar2 = fread(__ptr,sVar2,1,__stream);
            if (sVar2 == 1) {
              fclose(__stream);
              out_file_data->data = __ptr;
              out_file_data->size = __size;
              return OK;
            }
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",
                    0x32);
            __ptr_00 = "fread failed.\n";
            sStack_30 = 0xe;
          }
        }
      }
    }
    fwrite(__ptr_00,sStack_30,1,_stderr);
    fclose(__stream);
  }
  return ERROR;
}

Assistant:

Result file_read_aligned(const char* filename, size_t align,
                         FileData* out_file_data) {
  FILE* f = fopen(filename, "rb");
  CHECK_MSG(f, "unable to open file \"%s\".\n", filename);
  long size;
  CHECK(SUCCESS(get_file_size(f, &size)));
  long aligned_size = ALIGN_UP(size, align);
  u8* data = xcalloc(1, aligned_size);
  CHECK_MSG(data, "allocation failed.\n");
  CHECK_MSG(fread(data, size, 1, f) == 1, "fread failed.\n");
  fclose(f);
  out_file_data->data = data;
  out_file_data->size = aligned_size;
  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}